

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.h
# Opt level: O0

void __thiscall Assimp::LWS::Element::~Element(Element *this)

{
  Element *local_18;
  Element *this_local;
  
  std::__cxx11::list<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::~list
            (&this->children);
  local_18 = (Element *)&this->children;
  do {
    local_18 = (Element *)(local_18[-1].tokens[1].field_2._M_local_buf + 8);
    std::__cxx11::string::~string((string *)local_18);
  } while (local_18 != this);
  return;
}

Assistant:

Element()
    {}